

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<int>::SolveSOR
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *param_5,REAL overrelax,REAL *tol,
          int FromCurrent,int direction)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar8;
  long lVar9;
  int64_t j;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  long local_98;
  long lVar7;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<int> *)0x0) {
    iVar4 = (int)*tol * 2 + 1;
  }
  else {
    iVar4 = Dot<int>(residual,residual);
    dVar14 = (double)iVar4;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    iVar4 = (int)dVar14;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  lVar8 = lVar7 + -1;
  bVar13 = direction != -1;
  lVar10 = 0;
  if (bVar13) {
    lVar8 = 0;
  }
  lVar9 = -1;
  if (bVar13) {
    lVar9 = lVar7;
  }
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
    lVar10 = 0;
    do {
      if (ABS((double)iVar4) <= ABS(*tol)) break;
      if (lVar1 < 1) {
        dVar14 = 0.0;
      }
      else {
        local_98 = 0;
        lVar12 = 0;
        iVar4 = 0;
        lVar3 = lVar8;
        do {
          for (; lVar3 != lVar9; lVar3 = lVar3 + (ulong)bVar13 * 2 + -1) {
            iVar5 = (*(F->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x24])(F,lVar3,lVar12);
            if (0 < lVar7) {
              lVar11 = 0;
              do {
                iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar3,lVar11);
                lVar2 = (result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
                if ((lVar2 <= lVar11) ||
                   ((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar12)) {
                  TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                iVar5 = iVar5 - iVar6 * *(int *)((long)result->fElem + lVar11 * 4 + lVar2 * local_98
                                                );
                lVar11 = lVar11 + 1;
              } while (lVar7 != lVar11);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar3,lVar3);
            if (((lVar3 < 0) ||
                (lVar11 = (result->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow, lVar11 <= lVar3))
               || ((result->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol <= lVar12)) {
              TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            result->fElem[lVar11 * lVar12 + lVar3] =
                 result->fElem[lVar11 * lVar12 + lVar3] + (iVar5 * (int)overrelax) / iVar6;
            iVar4 = iVar4 + iVar5 * iVar5;
          }
          lVar12 = lVar12 + 1;
          local_98 = local_98 + 4;
          lVar3 = lVar8;
        } while (lVar12 != lVar1);
        dVar14 = (double)iVar4;
      }
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      iVar4 = (int)dVar14;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *numiterations);
  }
  if (residual != (TPZFMatrix<int> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar10;
  *tol = ABS((double)iVar4);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}